

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::process_list_elements
          (BinTextReader *this,ElementList *list,Type valueType)

{
  char *pcVar1;
  bool bVar2;
  char *start_1;
  char *start;
  Type valueType_local;
  ElementList *list_local;
  BinTextReader *this_local;
  
  TextReader::next_newline(&this->reader);
  while( true ) {
    bVar2 = TextReader::is_eof(&this->reader);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return true;
    }
    pcVar1 = (this->reader).cur_;
    bVar2 = read_element(this,list,valueType);
    if (!bVar2) break;
    pcVar1 = (this->reader).cur_;
    bVar2 = TextReader::read_nested_separator_or_eof(&this->reader);
    if (!bVar2) {
      bVar2 = fail_msg(this,"reader.read_nested_separator_or_eof()",pcVar1);
      return bVar2;
    }
  }
  bVar2 = fail_msg(this,"read_element(list, valueType)",pcVar1);
  return bVar2;
}

Assistant:

bool process_list_elements(ElementList& list, Type valueType) noexcept {
            reader.next_newline();
            while (!reader.is_eof()) {
                bin_assert(read_element(list, valueType));
                bin_assert(reader.read_nested_separator_or_eof());
            }
            return true;
        }